

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_color_replace_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_color color,rf_color replace,void *dst
          ,rf_int dst_size)

{
  rf_image image_00;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [20];
  _Bool _Var4;
  int iVar5;
  rf_color a;
  int iVar6;
  undefined8 in_stack_ffffffffffffff80;
  rf_color pixel_rgba32;
  void *dst_pixel;
  void *src_pixel;
  long lStack_38;
  int index;
  rf_int x;
  rf_int y;
  int bpp;
  rf_int dst_size_local;
  void *dst_local;
  rf_color replace_local;
  rf_color color_local;
  
  auVar3 = image._0_20_;
  dst_local._0_4_ = replace;
  dst_local._4_4_ = color;
  if ((((undefined1  [24])image & (undefined1  [24])0x100000000) == (undefined1  [24])0x0) ||
     (auVar1 = image._8_16_, image_00._16_8_ = in_stack_ffffffffffffff80,
     image_00.data = (void *)auVar1._0_8_, image_00.width = auVar1._8_4_,
     image_00.height = auVar1._12_4_, iVar5 = rf_image_size(image_00), dst_size < iVar5)) {
    memset(__return_storage_ptr__,0,0x18);
    iVar5 = rf_bytes_per_pixel(image.format);
    for (x = 0; x < image.height; x = x + 1) {
      for (lStack_38 = 0; lStack_38 < image.width; lStack_38 = lStack_38 + 1) {
        iVar6 = (int)x * image.width + (int)lStack_38;
        a = rf_format_one_pixel_to_rgba32((void *)(auVar3 + (long)(iVar6 * iVar5)),image.format);
        _Var4 = rf_color_match(a,dst_local._4_4_);
        if (_Var4) {
          rf_format_one_pixel(&dst_local,RF_UNCOMPRESSED_R8G8B8A8,
                              (void *)((long)dst + (long)(iVar6 * iVar5)),image.format);
        }
      }
    }
    __return_storage_ptr__->data = (void *)auVar3._0_8_;
    __return_storage_ptr__->width = auVar3._8_4_;
    __return_storage_ptr__->height = auVar3._12_4_;
    __return_storage_ptr__->format = auVar3._16_4_;
    __return_storage_ptr__->width = (int)image._8_8_;
    __return_storage_ptr__->height = (int)((ulong)image._8_8_ >> 0x20);
    uVar2 = image._16_8_;
    __return_storage_ptr__->format = (int)uVar2;
    __return_storage_ptr__->valid = (_Bool)(char)((ulong)uVar2 >> 0x20);
    *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar2 >> 0x28);
    __return_storage_ptr__->data = dst;
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_color_replace_to_buffer(rf_image image, rf_color color, rf_color replace, void* dst, rf_int dst_size)
{
    if (image.valid && dst_size >= rf_image_size(image)) return (rf_image) {0};

    rf_image result = {0};

    int bpp = rf_bytes_per_pixel(image.format);

    for (rf_int y = 0; y < image.height; y++)
    {
        for (rf_int x = 0; x < image.width; x++)
        {
            int index = y * image.width + x;

            void* src_pixel = ((unsigned char*)image.data) + index * bpp;
            void* dst_pixel = ((unsigned char*)dst) + index * bpp;

            rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

            if (rf_color_match(pixel_rgba32, color))
            {
                rf_format_one_pixel(&replace, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
            }
        }
    }

    result = image;
    result.data = dst;

    return result;
}